

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_manager.hpp
# Opt level: O2

void __thiscall
libtorrent::aux::alert_manager::emplace_alert<libtorrent::dht_bootstrap_alert>(alert_manager *this)

{
  int iVar1;
  alert *a;
  unique_lock<std::recursive_mutex> lock;
  
  ::std::unique_lock<std::recursive_mutex>::unique_lock(&lock,&this->m_mutex);
  iVar1 = this->m_generation;
  if ((this->m_alerts).super_array<libtorrent::heterogeneous_queue<libtorrent::alert>,_2UL>._M_elems
      [iVar1].m_num_items < this->m_queue_size_limit) {
    a = &heterogeneous_queue<libtorrent::alert>::
         emplace_back<libtorrent::dht_bootstrap_alert,libtorrent::aux::stack_allocator&>
                   ((this->m_alerts).
                    super_array<libtorrent::heterogeneous_queue<libtorrent::alert>,_2UL>._M_elems +
                    iVar1,(this->m_allocations).super_array<libtorrent::aux::stack_allocator,_2UL>.
                          _M_elems + iVar1)->super_alert;
    maybe_notify(this,a);
  }
  else {
    ::std::bitset<128UL>::set(&this->m_dropped,0x3e,true);
  }
  ::std::unique_lock<std::recursive_mutex>::~unique_lock(&lock);
  return;
}

Assistant:

void emplace_alert(Args&&... args) try
		{
			std::unique_lock<std::recursive_mutex> lock(m_mutex);

			heterogeneous_queue<alert>& queue = m_alerts[m_generation];

			// don't add more than this number of alerts, unless it's a
			// high priority alert, in which case we try harder to deliver it
			// for high priority alerts, double the upper limit
			if (queue.size() / (1 + static_cast<int>(T::priority)) >= m_queue_size_limit)
			{
				// record that we dropped an alert of this type
				m_dropped.set(T::alert_type);
				return;
			}

			T& alert = queue.emplace_back<T>(
				m_allocations[m_generation], std::forward<Args>(args)...);

			maybe_notify(&alert);
		}
		catch (std::bad_alloc const&)
		{
			// record that we dropped an alert of this type
			std::unique_lock<std::recursive_mutex> lock(m_mutex);
			m_dropped.set(T::alert_type);
		}